

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  ushort uVar1;
  Pgno PVar2;
  uint uVar3;
  BtShared *pBt;
  BtLock *pBVar4;
  Pager *pPager;
  u8 *puVar5;
  MemPage *pMVar6;
  uint uVar7;
  byte bVar8;
  u16 uVar9;
  int iVar10;
  int iVar11;
  u32 uVar12;
  u32 uVar13;
  BtLock **ppBVar14;
  Btree *pBVar15;
  uint uVar16;
  u32 uVar17;
  Wal *pWal;
  undefined1 auVar18 [16];
  int local_4c;
  MemPage *local_48;
  u32 *local_40;
  MemPage *pPage1;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (p->inTrans == '\x02') {
    if (wrflag != 0) {
LAB_00136ab1:
      iVar10 = sqlite3PagerOpenSavepoint(pBt->pPager,p->db->nSavepoint);
      goto LAB_0013702a;
    }
  }
  else if (wrflag != 0 || p->inTrans != '\x01') {
    uVar1 = pBt->btsFlags;
    if ((wrflag != 0) && ((uVar1 & 1) != 0)) {
      iVar10 = 8;
      goto LAB_0013702a;
    }
    if (wrflag == 0) {
      if ((uVar1 & 0x40) != 0) goto LAB_00136b27;
    }
    else {
      if (((uVar1 & 0x40) == 0) && (pBt->inTransaction != '\x02')) {
        if (wrflag < 2) goto LAB_00136b3b;
        ppBVar14 = &pBt->pLock;
        do {
          pBVar4 = *ppBVar14;
          if (pBVar4 == (BtLock *)0x0) goto LAB_00136b3b;
          pBVar15 = pBVar4->pBtree;
          ppBVar14 = &pBVar4->pNext;
        } while (pBVar15 == p);
      }
      else {
LAB_00136b27:
        pBVar15 = pBt->pWriter;
      }
      iVar10 = 0x106;
      if (pBVar15->db != (sqlite3 *)0x0) goto LAB_0013702a;
    }
LAB_00136b3b:
    iVar10 = querySharedCacheTableLock(p,1,'\x01');
    if (iVar10 == 0) {
      uVar1 = pBt->btsFlags;
      pBt->btsFlags = uVar1 & 0xfff7;
      if (pBt->nPage == 0) {
        pBt->btsFlags = uVar1 | 8;
      }
      local_40 = &pBt->pageSize;
      iVar10 = 0;
LAB_00136b79:
      do {
        if (pBt->pPage1 == (MemPage *)0x0) {
          iVar11 = sqlite3PagerSharedLock(pBt->pPager);
          if ((iVar11 != 0) ||
             (iVar11 = btreeGetPage(pBt,1,&pPage1,0,0), pMVar6 = pPage1, iVar11 != 0))
          goto LAB_00136df6;
          puVar5 = pPage1->aData;
          uVar13 = sqlite3Get4byte(puVar5 + 0x1c);
          uVar12 = pBt->pPager->dbSize;
          local_48 = pMVar6;
          if ((uVar13 == 0) || (*(int *)(puVar5 + 0x18) != *(int *)(puVar5 + 0x5c))) {
            uVar13 = uVar12;
          }
          if ((int)uVar13 < 1) {
            uVar17 = pBt->usableSize;
LAB_00136d21:
            iVar11 = 0;
            iVar10 = (uVar17 * 0x40 - 0x300) / 0xff - 0x17;
            pBt->maxLocal = (ushort)iVar10;
            uVar9 = (short)((ulong)(uVar17 * 0x20 - 0x180) / 0xff) - 0x17;
            pBt->minLocal = uVar9;
            pBt->maxLeaf = (short)uVar17 - 0x23;
            if (0x7e < (ushort)iVar10) {
              iVar10 = 0x7f;
            }
            pBt->minLeaf = uVar9;
            pBt->max1bytePayload = (u8)iVar10;
            pBt->pPage1 = local_48;
            pBt->nPage = uVar13;
LAB_00136d82:
            iVar10 = 0;
            if (iVar11 == 0) goto LAB_00136b79;
          }
          else {
            auVar18[0] = -(*puVar5 == 'S');
            auVar18[1] = -(puVar5[1] == 'Q');
            auVar18[2] = -(puVar5[2] == 'L');
            auVar18[3] = -(puVar5[3] == 'i');
            auVar18[4] = -(puVar5[4] == 't');
            auVar18[5] = -(puVar5[5] == 'e');
            auVar18[6] = -(puVar5[6] == ' ');
            auVar18[7] = -(puVar5[7] == 'f');
            auVar18[8] = -(puVar5[8] == 'o');
            auVar18[9] = -(puVar5[9] == 'r');
            auVar18[10] = -(puVar5[10] == 'm');
            auVar18[0xb] = -(puVar5[0xb] == 'a');
            auVar18[0xc] = -(puVar5[0xc] == 't');
            auVar18[0xd] = -(puVar5[0xd] == ' ');
            auVar18[0xe] = -(puVar5[0xe] == '3');
            auVar18[0xf] = -(puVar5[0xf] == '\0');
            iVar11 = 0x1a;
            if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
              if (2 < puVar5[0x12]) {
                *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
              }
              if (puVar5[0x13] < 3) {
                if ((puVar5[0x13] == 2) && ((pBt->btsFlags & 0x10) == 0)) {
                  local_4c = 0;
                  iVar11 = sqlite3PagerOpenWal(pBt->pPager,&local_4c);
                  if (iVar11 == 0) {
                    if (local_4c != 0) goto LAB_00136e68;
                    releasePage(local_48);
                    iVar11 = 0;
                    goto LAB_00136d82;
                  }
                }
                else {
LAB_00136e68:
                  iVar10 = bcmp(puVar5 + 0x15,"@  ",3);
                  iVar11 = 0x1a;
                  if (iVar10 == 0) {
                    uVar7 = (uint)puVar5[0x10] * 0x100;
                    uVar3 = (uint)puVar5[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar3 + uVar7) - 0x10001) &&
                       (uVar16 = uVar3 | uVar7, ((uVar7 + uVar3) - 1 & uVar16) == 0)) {
                      bVar8 = puVar5[0x14];
                      uVar17 = uVar16 - bVar8;
                      if (uVar16 != *local_40) {
                        releasePage(local_48);
                        pBt->usableSize = uVar17;
                        pBt->pageSize = uVar16;
                        freeTempSpace(pBt);
                        iVar11 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar8);
                        goto LAB_00136d82;
                      }
                      if (((pBt->db->flags & 0x8000) == 0) && ((int)uVar12 < (int)uVar13)) {
                        sqlite3CorruptError(0xcb33);
                        iVar11 = 0xb;
                      }
                      else {
                        iVar11 = 0x1a;
                        if (0x1df < uVar17) {
                          pBt->pageSize = uVar16;
                          pBt->usableSize = uVar17;
                          uVar12 = sqlite3Get4byte(puVar5 + 0x34);
                          pBt->autoVacuum = uVar12 != 0;
                          uVar12 = sqlite3Get4byte(puVar5 + 0x40);
                          pBt->incrVacuum = uVar12 != 0;
                          goto LAB_00136d21;
                        }
                      }
                    }
                  }
                }
              }
            }
            releasePage(local_48);
            pBt->pPage1 = (MemPage *)0x0;
          }
        }
        else if ((wrflag == 0) || (iVar10 != 0)) {
LAB_00136deb:
          iVar11 = iVar10;
          if (iVar10 == 0) {
            if ((p->inTrans == '\0') &&
               (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0')) {
              (p->lock).eLock = '\x01';
              (p->lock).pNext = pBt->pLock;
              pBt->pLock = &p->lock;
            }
            bVar8 = 2 - (wrflag == 0);
            p->inTrans = bVar8;
            if (pBt->inTransaction < bVar8) {
              pBt->inTransaction = bVar8;
            }
            if (wrflag == 0) goto LAB_00137027;
            pMVar6 = pBt->pPage1;
            pBt->pWriter = p;
            pBt->btsFlags = (ushort)(1 < wrflag) << 5 | pBt->btsFlags & 0xffdf;
            uVar12 = pBt->nPage;
            uVar13 = sqlite3Get4byte(pMVar6->aData + 0x1c);
            if (uVar12 == uVar13) goto LAB_00136ab1;
            iVar10 = sqlite3PagerWrite(pMVar6->pDbPage);
            if (iVar10 == 0) {
              uVar3 = pBt->nPage;
              *(uint *)(pMVar6->aData + 0x1c) =
                   uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
              goto LAB_00136ab1;
            }
            break;
          }
        }
        else {
          iVar11 = 8;
          if ((pBt->btsFlags & 1) == 0) {
            pPager = pBt->pPager;
            iVar11 = pPager->errCode;
            if (pPager->errCode == 0) {
              pPager->subjInMemory = p->db->temp_store == '\x02';
              if (pPager->eState != '\x01') {
LAB_00136de3:
                iVar10 = newDatabase(pBt);
                goto LAB_00136deb;
              }
              pWal = pPager->pWal;
              if (pWal == (Wal *)0x0) {
                iVar11 = pagerLockDb(pPager,2);
                if (iVar11 == 0 && 1 < wrflag) {
                  iVar11 = pager_wait_on_lock(pPager,4);
                }
                if (iVar11 == 0) {
LAB_00136dc3:
                  pPager->eState = '\x02';
                  PVar2 = pPager->dbSize;
                  pPager->dbHintSize = PVar2;
                  pPager->dbFileSize = PVar2;
                  pPager->dbOrigSize = PVar2;
                  pPager->journalOff = 0;
                  goto LAB_00136de3;
                }
              }
              else {
                if ((pPager->exclusiveMode != '\0') && (pWal->exclusiveMode == '\0')) {
                  iVar11 = pagerLockDb(pPager,4);
                  if (iVar11 != 0) goto LAB_00136df6;
                  sqlite3WalExclusiveMode(pPager->pWal,1);
                  pWal = pPager->pWal;
                }
                iVar11 = 8;
                if ((pWal->readOnly == '\0') && (iVar11 = walLockExclusive(pWal,0,1), iVar11 == 0))
                {
                  pWal->writeLock = '\x01';
                  iVar10 = bcmp(&pWal->hdr,*pWal->apWiData,0x30);
                  if (iVar10 == 0) goto LAB_00136dc3;
                  walUnlockExclusive(pWal,0,1);
                  pWal->writeLock = '\0';
                  iVar11 = 5;
                }
              }
            }
          }
        }
LAB_00136df6:
        iVar10 = iVar11;
        unlockBtreeIfUnused(pBt);
        if ((((char)iVar10 != '\x05') || (pBt->inTransaction != '\0')) ||
           (iVar11 = btreeInvokeBusyHandler(pBt), iVar11 == 0)) break;
      } while( true );
    }
    goto LAB_0013702a;
  }
LAB_00137027:
  iVar10 = 0;
LAB_0013702a:
  sqlite3BtreeLeave(p);
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  sqlite3 *pBlock = 0;
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  /* If another database handle has already opened a write transaction 
  ** on this shared-btree structure and a second write transaction is
  ** requested, return SQLITE_LOCKED.
  */
  if( (wrflag && pBt->inTransaction==TRANS_WRITE)
   || (pBt->btsFlags & BTS_PENDING)!=0
  ){
    pBlock = pBt->pWriter->db;
  }else if( wrflag>1 ){
    BtLock *pIter;
    for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
      if( pIter->pBtree!=p ){
        pBlock = pIter->pBtree->db;
        break;
      }
    }
  }
  if( pBlock ){
    sqlite3ConnectionBlocked(p->db, pBlock);
    rc = SQLITE_LOCKED_SHAREDCACHE;
    goto trans_begun;
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}